

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmVariableDefinition
                    (ExpressionContext *ctx,VmModule *module,ExprVariableDefinition *node)

{
  VariableData *source;
  bool bVar1;
  VariableData *variable;
  VmConstant *pVVar2;
  VmValue *pVVar3;
  VmConstant *el1;
  VmConstant *el2;
  TypeBase *in_RCX;
  TypeBase *type;
  SynBase *pSVar4;
  VmValueType VVar5;
  ulong uVar6;
  VmType type_00;
  SynBase *local_48;
  
  if (node->initializer != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->initializer);
    goto LAB_0019d2b4;
  }
  source = node->variable->variable;
  if (((source->isVmAlloca != false) || (source->lookupOnly != false)) ||
     (bVar1 = IsLocalScope(source->scope), !bVar1)) goto LAB_0019d2b4;
  type_00 = GetVmType(ctx,(TypeBase *)((InplaceStr *)&source->type)->begin);
  variable = (VariableData *)
             ExpressionContext::GetReferenceType
                       (ctx,(TypeBase *)((InplaceStr *)&source->type)->begin);
  pVVar3 = anon_unknown.dwarf_11cad6::CreateVariableAddress
                     (module,(SynBase *)source,variable,in_RCX);
  VVar5 = type_00.type;
  uVar6 = type_00._0_8_ >> 0x20;
  if ((VVar5 == VM_TYPE_INT && uVar6 == 4) ||
     ((VVar5 & ~VM_TYPE_INT) == VM_TYPE_DOUBLE && type_00.size == 8)) {
    pVVar2 = CreateConstantZero(ctx->allocator,(node->super_ExprBase).source,type_00);
LAB_0019d297:
    pSVar4 = (node->super_ExprBase).source;
    type = (TypeBase *)((InplaceStr *)&source->type)->begin;
    goto LAB_0019d2ac;
  }
  switch(VVar5) {
  case VM_TYPE_POINTER:
    pVVar2 = CreateConstantPointer
                       (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                        (TypeBase *)((InplaceStr *)&source->type)->begin,false);
    goto LAB_0019d297;
  case VM_TYPE_FUNCTION_REF:
  case VM_TYPE_ARRAY_REF:
    local_48 = (node->super_ExprBase).source;
    pVVar2 = CreateConstantPointer
                       (module->allocator,local_48,0,(VariableData *)0x0,ctx->typeNullPtr,false);
    el1 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    break;
  case VM_TYPE_AUTO_REF:
    local_48 = (node->super_ExprBase).source;
    pVVar2 = CreateConstantInt(module->allocator,local_48,0);
    el1 = CreateConstantPointer
                    (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                     ctx->typeNullPtr,false);
    break;
  case VM_TYPE_AUTO_ARRAY:
    local_48 = (node->super_ExprBase).source;
    pVVar2 = CreateConstantInt(module->allocator,local_48,0);
    el1 = CreateConstantPointer
                    (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                     ctx->typeNullPtr,false);
    el2 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    goto LAB_0019d429;
  case VM_TYPE_STRUCT:
    if (uVar6 != 0) {
      pSVar4 = (node->super_ExprBase).source;
      pVVar2 = CreateConstantZero(ctx->allocator,pSVar4,(VmType)ZEXT816(0x400000001));
      anon_unknown.dwarf_11cad6::CreateSetRange
                (module,pSVar4,pVVar3,type_00.size >> 2,&pVVar2->super_VmValue,4);
    }
    goto LAB_0019d2b4;
  default:
    if ((uVar6 != 0) || (VVar5 != VM_TYPE_VOID)) {
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0xd72,
                    "VmValue *CompileVmVariableDefinition(ExpressionContext &, VmModule *, ExprVariableDefinition *)"
                   );
    }
    goto LAB_0019d2b4;
  }
  el2 = (VmConstant *)0x0;
LAB_0019d429:
  pVVar2 = (VmConstant *)
           anon_unknown.dwarf_11cad6::CreateConstruct
                     (module,local_48,type_00,&pVVar2->super_VmValue,&el1->super_VmValue,
                      &el2->super_VmValue,&pVVar2->super_VmValue);
  pSVar4 = (node->super_ExprBase).source;
  type = (TypeBase *)((InplaceStr *)&source->type)->begin;
LAB_0019d2ac:
  anon_unknown.dwarf_11cad6::CreateStore(ctx,module,pSVar4,type,pVVar3,&pVVar2->super_VmValue,0);
LAB_0019d2b4:
  pVVar3 = anon_unknown.dwarf_11cad6::CreateVoid(module);
  pVVar3 = anon_unknown.dwarf_11cad6::CheckType(ctx,&node->super_ExprBase,pVVar3);
  return pVVar3;
}

Assistant:

VmValue* CompileVmVariableDefinition(ExpressionContext &ctx, VmModule *module, ExprVariableDefinition *node)
{
	VariableData *variable = node->variable->variable;

	if(node->initializer)
	{
		CompileVm(ctx, module, node->initializer);
	}
	else if(!variable->isVmAlloca && !variable->lookupOnly && IsLocalScope(variable->scope))
	{
		VmType vmType = GetVmType(ctx, variable->type);

		VmValue *address = CreateVariableAddress(module, node->source, variable, ctx.GetReferenceType(variable->type));

		if(vmType == VmType::Int || vmType == VmType::Double || vmType == VmType::Long)
		{
			VmValue *initializer = CreateConstantZero(ctx.allocator, node->source, vmType);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_POINTER)
		{
			VmValue *initializer = CreateConstantPointer(module->allocator, node->source, 0, NULL, variable->type, false);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_FUNCTION_REF)
		{
			VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_ARRAY_REF)
		{
			VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_AUTO_REF)
		{
			VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), NULL, NULL);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_AUTO_ARRAY)
		{
			VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_STRUCT)
		{
			if(vmType.size != 0)
				CreateSetRange(module, node->source, address, vmType.size / 4, CreateConstantZero(ctx.allocator, node->source, VmType::Int), 4);
		}
		else if(vmType != VmType::Void)
		{
			assert(!"unknown type");
		}
	}

	return CheckType(ctx, node, CreateVoid(module));
}